

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

bool __thiscall DynamicGraph::checkComponentBreak(DynamicGraph *this,Vertex *v,Vertex *u)

{
  bool bVar1;
  bool bVar2;
  AdjList *g;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference rVar3;
  list<unsigned_long,_std::allocator<unsigned_long>_> visitedListU;
  list<unsigned_long,_std::allocator<unsigned_long>_> visitedListV;
  list<unsigned_long,_std::allocator<unsigned_long>_> queueU;
  list<unsigned_long,_std::allocator<unsigned_long>_> queueV;
  vector<bool,_std::allocator<bool>_> visitedU;
  vector<bool,_std::allocator<bool>_> visitedV;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Bvector_base<std::allocator<bool>_> local_80;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_98._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
  local_98._M_impl._M_node._M_size = 0;
  local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
  local_b0._M_impl._M_node._M_size = 0;
  local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
  local_b0._M_impl._M_node.super__List_node_base._M_prev =
       local_b0._M_impl._M_node.super__List_node_base._M_next;
  local_98._M_impl._M_node.super__List_node_base._M_prev =
       local_98._M_impl._M_node.super__List_node_base._M_next;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_80,
             (allocator_type *)&local_c8);
  local_c8._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       ((ulong)local_c8._M_impl._M_node.super__List_node_base._M_next & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_80,
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_c8,
             (allocator_type *)&local_e0);
  local_c8._M_impl._M_node._M_size = 0;
  local_e0._M_impl._M_node._M_size = 0;
  local_e0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_e0;
  local_e0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_e0;
  local_c8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c8;
  local_c8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c8;
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)&local_58,*v);
  *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)&local_80,*u);
  *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,v);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0,u);
  this_00 = &local_c8;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,v);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e0,u);
  do {
    bVar1 = local_b0._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_b0
            || local_98._M_impl._M_node.super__List_node_base._M_next ==
               (_List_node_base *)&local_98;
    if ((bVar1) || (this->halt != false)) goto LAB_0010b0a3;
    bVar2 = bdbfsStep(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
                      (vector<bool,_std::allocator<bool>_> *)&local_58,
                      (vector<bool,_std::allocator<bool>_> *)&local_80,
                      (list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    if ((!bVar2) || (this->halt != false)) goto LAB_0010b0a3;
    if (local_98._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_98)
    goto LAB_0010b08e;
    bVar2 = bdbfsStep(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0,
                      (vector<bool,_std::allocator<bool>_> *)&local_80,
                      (vector<bool,_std::allocator<bool>_> *)&local_58,
                      (list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e0);
    if ((!bVar2) || (this->halt != false)) goto LAB_0010b0a3;
  } while (local_b0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b0);
  this_00 = &local_e0;
LAB_0010b08e:
  this->halt = true;
  updateVisitedComponents(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  bVar1 = true;
LAB_0010b0a3:
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_e0);
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_c8);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_b0);
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_98);
  return bVar1;
}

Assistant:

bool DynamicGraph::checkComponentBreak(const Vertex &v, const Vertex &u)
{
    std::list<Vertex> queueV;
    std::list<Vertex> queueU;
    std::vector<bool> visitedV(boost::num_vertices(*this), false);
    std::vector<bool> visitedU(boost::num_vertices(*this), false);
    std::list<Vertex> visitedListV;
    std::list<Vertex> visitedListU;

    // Using bidirectional BFS
    visitedV[v]=true;
    visitedU[u]=true;
    queueV.push_back(v);
    queueU.push_back(u);
    visitedListV.push_back(v);
    visitedListU.push_back(u);
    while(!queueV.empty() && !queueU.empty()) {
        if (this->halt) {
            return false;
        }

        if(!this->bdbfsStep(queueV, visitedV, visitedU, visitedListV)
           || this->halt) {
            return false;
        }

        if (queueV.empty()) {
            this->halt = true;
            updateVisitedComponents(visitedListV);
            break;
        }

        if(!this->bdbfsStep(queueU, visitedU, visitedV, visitedListU)
           || this->halt) {
            return false;
        }

        if (queueU.empty()) {
            this->halt = true;
            updateVisitedComponents(visitedListU);
            break;
        }
    }
    return true;
}